

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall
Json::OurReader::parse(OurReader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  bool bVar1;
  allocator local_69;
  Token token;
  string local_50;
  
  bVar1 = (this->features_).allowComments_;
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(collectComments & bVar1);
  this->current_ = beginDoc;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  std::__cxx11::string::assign((char *)&this->commentsBefore_);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::clear
            (&this->errors_);
  while ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_50._M_dataplus._M_p = (pointer)root;
  std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
            ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_50);
  this->stackDepth_ = 0;
  bVar1 = readValue(this);
  skipCommentTokens(this,&token);
  if (((this->features_).failIfExtra_ == true) &&
     ((token.type_ != tokenEndOfStream & (token.type_ != tokenError | (this->features_).strictRoot_)
      ) == 1)) {
    std::__cxx11::string::string
              ((string *)&local_50,"Extra non-whitespace after JSON value.",&local_69);
    addError(this,&local_50,&token,(Location)0x0);
  }
  else {
    if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
      Value::setComment(root,&this->commentsBefore_,commentAfter);
    }
    if ((this->features_).strictRoot_ != true) {
      return bVar1;
    }
    if ((*(ushort *)&root->field_0x8 & 0xfe) == 6) {
      return bVar1;
    }
    token.type_ = tokenError;
    token.start_ = beginDoc;
    token.end_ = endDoc;
    std::__cxx11::string::string
              ((string *)&local_50,
               "A valid JSON document must be either an array or an object value.",&local_69);
    addError(this,&local_50,&token,(Location)0x0);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return false;
}

Assistant:

bool OurReader::parse(const char* beginDoc,
                   const char* endDoc,
                   Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = 0;
  lastValue_ = 0;
  commentsBefore_ = "";
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  stackDepth_ = 0;
  bool successful = readValue();
  Token token;
  skipCommentTokens(token);
  if (features_.failIfExtra_) {
    if ((features_.strictRoot_ || token.type_ != tokenError) && token.type_ != tokenEndOfStream) {
      addError("Extra non-whitespace after JSON value.", token);
      return false;
    }
  }
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}